

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void NULLCVector::VectorReserve(uint size,vector *vec)

{
  NULLCArray NVar1;
  
  if ((vec->data).len < size) {
    NVar1 = nullcAllocateArrayTyped((vec->data).typeID,size);
    if (NVar1.ptr != (char *)0x0) {
      memcpy(NVar1.ptr,(vec->data).ptr,(ulong)((vec->data).len * vec->elemSize));
      (vec->data).ptr = NVar1.ptr;
      (vec->data).len = NVar1.len;
    }
  }
  return;
}

Assistant:

void VectorReserve(unsigned int size, vector* vec)
	{
		// If not enough space
		if(size > vec->data.len)
		{
			// Allocate new
			NULLCArray newData = nullcAllocateArrayTyped(vec->data.typeID, size);

			if(!newData.ptr)
				return;

			memcpy(newData.ptr, vec->data.ptr, unsigned(vec->elemSize * vec->data.len));

			vec->data.ptr = newData.ptr;
			vec->data.len = newData.len;
		}
	}